

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_api.h
# Opt level: O1

bool __thiscall benchmark::State::KeepRunning(State *this)

{
  ulong uVar1;
  ulong uVar2;
  
  if (this->started_ == false) {
    KeepRunning(this);
  }
  uVar1 = this->total_iterations_;
  uVar2 = this->max_iterations;
  this->total_iterations_ = uVar1 + 1;
  if (uVar2 <= uVar1) {
    KeepRunning();
  }
  return uVar1 < uVar2;
}

Assistant:

bool KeepRunning() {
    if (BENCHMARK_BUILTIN_EXPECT(!started_, false)) {
      assert(!finished_);
      started_ = true;
      ResumeTiming();
    }
    bool const res = total_iterations_++ < max_iterations;
    if (BENCHMARK_BUILTIN_EXPECT(!res, false)) {
      assert(started_ && (!finished_ || error_occurred_));
      if (!error_occurred_) {
        PauseTiming();
      }
      // Total iterations now is one greater than max iterations. Fix this.
      total_iterations_ = max_iterations;
      finished_ = true;
    }
    return res;
  }